

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enums.cpp
# Opt level: O0

string * __thiscall
libcellml::cellmlElementTypeAsString_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,CellmlElementType value)

{
  mapped_type *pmVar1;
  key_type local_14;
  string *psStack_10;
  CellmlElementType value_local;
  
  local_14 = (key_type)this;
  psStack_10 = __return_storage_ptr__;
  pmVar1 = std::
           map<libcellml::CellmlElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::CellmlElementType>,_std::allocator<std::pair<const_libcellml::CellmlElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<libcellml::CellmlElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::CellmlElementType>,_std::allocator<std::pair<const_libcellml::CellmlElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)cellmlElementTypeToString_abi_cxx11_,&local_14);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cellmlElementTypeAsString(CellmlElementType value)
{
    return cellmlElementTypeToString.at(value);
}